

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lrn_x86.cpp
# Opt level: O0

int __thiscall ncnn::LRN_x86::forward_inplace(LRN_x86 *this,Mat *bottom_top_blob,Option *opt)

{
  double dVar1;
  bool bVar2;
  float *pfVar3;
  vector<int,_std::allocator<int>_> *this_00;
  undefined8 *in_RDX;
  long in_RSI;
  long *in_RDI;
  float val;
  int k;
  float ss;
  float *sptr_1;
  int j_1;
  int i_4;
  Mat m;
  float *ptr_2;
  int q_2;
  int j;
  int i_3;
  int gap;
  int p2;
  int p1;
  int *space_ofs;
  vector<int,_std::allocator<int>_> _space_ofs;
  float alpha_div_size_1;
  int maxk;
  Option opt_b;
  int pad;
  Mat square_blob_bordered;
  int outh;
  int outw;
  int i_1;
  float *ssptr;
  float *ptr_1;
  int i_2;
  float *ssptr_1;
  float *sptr;
  int p;
  int q_1;
  float alpha_div_size;
  Mat square_sum;
  int i;
  float *outptr;
  float *ptr;
  int q;
  Mat square_blob;
  int size;
  size_t elemsize;
  int channels;
  int h;
  int w;
  undefined4 in_stack_fffffffffffffad8;
  undefined4 in_stack_fffffffffffffadc;
  Mat *in_stack_fffffffffffffae0;
  Mat *pMVar4;
  undefined4 in_stack_fffffffffffffae8;
  float fVar5;
  float in_stack_fffffffffffffaec;
  Mat *in_stack_fffffffffffffaf0;
  size_type in_stack_fffffffffffffaf8;
  Mat *in_stack_fffffffffffffb00;
  int _c;
  Mat *in_stack_fffffffffffffb08;
  float in_stack_fffffffffffffb14;
  int in_stack_fffffffffffffb18;
  int in_stack_fffffffffffffb1c;
  undefined8 in_stack_fffffffffffffb20;
  Mat *in_stack_fffffffffffffb28;
  Mat *in_stack_fffffffffffffb30;
  int in_stack_fffffffffffffb40;
  undefined4 in_stack_fffffffffffffb48;
  undefined4 in_stack_fffffffffffffb4c;
  int local_480;
  float local_47c;
  int local_470;
  int local_46c;
  Mat local_468;
  Mat local_420;
  float *local_3d8;
  int local_3d0;
  int local_3cc;
  int local_3c8;
  int local_3c4;
  int local_3c0;
  int local_3bc;
  reference local_3b8;
  undefined1 local_3a9 [25];
  float local_390;
  int local_38c;
  Mat local_388;
  int local_314;
  int local_310;
  int local_2f4;
  int local_2f0;
  int local_2ec;
  Mat local_2e8;
  float *local_2a0;
  Mat local_298;
  float *local_250;
  int local_244;
  Mat local_240;
  float *local_1f8;
  Mat local_1f0;
  float *local_1a8;
  int local_19c;
  int local_198;
  float local_194;
  Mat local_190;
  int local_144;
  Mat local_140;
  float *local_f8;
  Mat local_f0;
  float *local_a8;
  int local_9c;
  int local_98;
  Mat local_88;
  int local_3c;
  undefined8 local_38;
  int local_2c;
  int local_28;
  int local_24;
  undefined8 *local_20;
  int local_4;
  
  local_24 = *(int *)(in_RSI + 0x2c);
  local_28 = *(int *)(in_RSI + 0x30);
  local_2c = *(int *)(in_RSI + 0x38);
  local_38 = *(undefined8 *)(in_RSI + 0x10);
  local_3c = local_24 * local_28;
  local_20 = in_RDX;
  ncnn::Mat::Mat(&local_88);
  ncnn::Mat::create(in_stack_fffffffffffffb00,(int)(in_stack_fffffffffffffaf8 >> 0x20),
                    (int)in_stack_fffffffffffffaf8,(int)((ulong)in_stack_fffffffffffffaf0 >> 0x20),
                    CONCAT44(in_stack_fffffffffffffaec,in_stack_fffffffffffffae8),
                    (Allocator *)in_stack_fffffffffffffae0);
  bVar2 = ncnn::Mat::empty(in_stack_fffffffffffffae0);
  if (bVar2) {
    local_4 = -100;
    local_98 = 1;
    goto LAB_004adbed;
  }
  for (local_9c = 0; local_9c < local_2c; local_9c = local_9c + 1) {
    ncnn::Mat::channel(in_stack_fffffffffffffb08,(int)((ulong)in_stack_fffffffffffffb00 >> 0x20));
    pfVar3 = ncnn::Mat::operator_cast_to_float_(&local_f0);
    ncnn::Mat::~Mat((Mat *)0x4aceb6);
    local_a8 = pfVar3;
    ncnn::Mat::channel(in_stack_fffffffffffffb08,(int)((ulong)in_stack_fffffffffffffb00 >> 0x20));
    pfVar3 = ncnn::Mat::operator_cast_to_float_(&local_140);
    ncnn::Mat::~Mat((Mat *)0x4acf05);
    local_f8 = pfVar3;
    for (local_144 = 0; local_144 < local_3c; local_144 = local_144 + 1) {
      *local_f8 = *local_a8 * *local_a8;
      local_a8 = local_a8 + 1;
      local_f8 = local_f8 + 1;
    }
  }
  if (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd0) == 0) {
    ncnn::Mat::Mat(&local_190);
    ncnn::Mat::create(in_stack_fffffffffffffb00,(int)(in_stack_fffffffffffffaf8 >> 0x20),
                      (int)in_stack_fffffffffffffaf8,(int)((ulong)in_stack_fffffffffffffaf0 >> 0x20)
                      ,CONCAT44(in_stack_fffffffffffffaec,in_stack_fffffffffffffae8),
                      (Allocator *)in_stack_fffffffffffffae0);
    bVar2 = ncnn::Mat::empty(in_stack_fffffffffffffae0);
    if (bVar2) {
      local_4 = -100;
      local_98 = 1;
    }
    else {
      ncnn::Mat::fill(in_stack_fffffffffffffaf0,in_stack_fffffffffffffaec);
      local_194 = *(float *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd8) /
                  (float)*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd4);
      for (local_198 = 0; local_198 < local_2c; local_198 = local_198 + 1) {
        for (local_19c = local_198 - *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd4) / 2;
            _c = (int)((ulong)in_stack_fffffffffffffb00 >> 0x20),
            local_19c <= local_198 + *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd4) / 2;
            local_19c = local_19c + 1) {
          if ((-1 < local_19c) && (local_19c < local_2c)) {
            ncnn::Mat::channel(in_stack_fffffffffffffb08,_c);
            pfVar3 = ncnn::Mat::operator_cast_to_float_(&local_1f0);
            ncnn::Mat::~Mat((Mat *)0x4ad1e5);
            local_1a8 = pfVar3;
            ncnn::Mat::channel(in_stack_fffffffffffffb08,
                               (int)((ulong)in_stack_fffffffffffffb00 >> 0x20));
            pfVar3 = ncnn::Mat::operator_cast_to_float_(&local_240);
            ncnn::Mat::~Mat((Mat *)0x4ad231);
            local_1f8 = pfVar3;
            for (local_244 = 0; local_244 < local_3c; local_244 = local_244 + 1) {
              *local_1f8 = *local_1a8 + *local_1f8;
              local_1a8 = local_1a8 + 1;
              local_1f8 = local_1f8 + 1;
            }
          }
        }
        ncnn::Mat::channel(in_stack_fffffffffffffb08,_c);
        pfVar3 = ncnn::Mat::operator_cast_to_float_(&local_298);
        ncnn::Mat::~Mat((Mat *)0x4ad357);
        local_250 = pfVar3;
        ncnn::Mat::channel(in_stack_fffffffffffffb08,(int)((ulong)in_stack_fffffffffffffb00 >> 0x20)
                          );
        pfVar3 = ncnn::Mat::operator_cast_to_float_(&local_2e8);
        ncnn::Mat::~Mat((Mat *)0x4ad3a3);
        local_2a0 = pfVar3;
        for (local_2ec = 0; local_2ec < local_3c; local_2ec = local_2ec + 1) {
          fVar5 = *local_250;
          dVar1 = std::pow((double)(ulong)(uint)(*(float *)((long)in_RDI +
                                                           *(long *)(*in_RDI + -0x18) + 0xe0) +
                                                local_194 * *local_2a0),
                           (double)((ulong)*(uint *)((long)in_RDI +
                                                    *(long *)(*in_RDI + -0x18) + 0xdc) ^
                                   0x8000000080000000));
          *local_250 = fVar5 * SUB84(dVar1,0);
          local_2a0 = local_2a0 + 1;
          local_250 = local_250 + 1;
        }
      }
      local_98 = 0;
    }
    ncnn::Mat::~Mat((Mat *)0x4ad507);
joined_r0x004adbb3:
    if (local_98 != 0) goto LAB_004adbed;
  }
  else if (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd0) == 1) {
    local_2f0 = local_24;
    local_2f4 = local_28;
    ncnn::Mat::Mat(in_stack_fffffffffffffae0,
                   (Mat *)CONCAT44(in_stack_fffffffffffffadc,in_stack_fffffffffffffad8));
    local_388.cstep._4_4_ = *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd4) / 2;
    if (local_388.cstep._4_4_ < 1) {
LAB_004ad6c6:
      local_38c = *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd4);
      local_38c = local_38c * local_38c;
      local_390 = *(float *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd8) / (float)local_38c;
      this_00 = (vector<int,_std::allocator<int>_> *)(long)local_38c;
      pMVar4 = (Mat *)local_3a9;
      std::allocator<int>::allocator((allocator<int> *)0x4ad72b);
      std::vector<int,_std::allocator<int>_>::vector
                (this_00,in_stack_fffffffffffffaf8,(allocator_type *)in_stack_fffffffffffffaf0);
      std::allocator<int>::~allocator((allocator<int> *)0x4ad751);
      local_3b8 = std::vector<int,_std::allocator<int>_>::operator[]
                            ((vector<int,_std::allocator<int>_> *)(local_3a9 + 1),0);
      local_3bc = 0;
      local_3c0 = 0;
      local_3c4 = local_24 - *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd4);
      for (local_3c8 = 0; local_3c8 < *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd4);
          local_3c8 = local_3c8 + 1) {
        for (local_3cc = 0; local_3cc < *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd4);
            local_3cc = local_3cc + 1) {
          local_3b8[local_3bc] = local_3c0;
          local_3bc = local_3bc + 1;
          local_3c0 = local_3c0 + 1;
        }
        local_3c0 = local_3c4 + local_3c0;
      }
      for (local_3d0 = 0; local_3d0 < local_2c; local_3d0 = local_3d0 + 1) {
        ncnn::Mat::channel(pMVar4,(int)((ulong)this_00 >> 0x20));
        pfVar3 = ncnn::Mat::operator_cast_to_float_(&local_420);
        ncnn::Mat::~Mat((Mat *)0x4ad8fa);
        local_3d8 = pfVar3;
        ncnn::Mat::channel(pMVar4,(int)((ulong)this_00 >> 0x20));
        for (local_46c = 0; local_46c < local_2f4; local_46c = local_46c + 1) {
          for (local_470 = 0; local_470 < local_2f0; local_470 = local_470 + 1) {
            in_stack_fffffffffffffaf0 = (Mat *)ncnn::Mat::row(&local_468,local_46c);
            local_47c = 0.0;
            for (local_480 = 0; local_480 < local_38c; local_480 = local_480 + 1) {
              local_47c = *(float *)((long)&in_stack_fffffffffffffaf0->data +
                                    (long)local_3b8[local_480] * 4 + (long)local_470 * 4) +
                          local_47c;
            }
            fVar5 = local_3d8[local_470];
            dVar1 = std::pow((double)(ulong)(uint)(*(float *)((long)in_RDI +
                                                             *(long *)(*in_RDI + -0x18) + 0xe0) +
                                                  local_390 * local_47c),
                             (double)((ulong)*(uint *)((long)in_RDI +
                                                      *(long *)(*in_RDI + -0x18) + 0xdc) ^
                                     0x8000000080000000));
            local_3d8[local_470] = fVar5 * SUB84(dVar1,0);
          }
          local_3d8 = local_3d8 + local_2f0;
        }
        ncnn::Mat::~Mat((Mat *)0x4adb6f);
      }
      std::vector<int,_std::allocator<int>_>::~vector
                ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffaf0);
      local_98 = 0;
    }
    else {
      local_388.data = (void *)*local_20;
      local_388.elemsize._0_4_ = *(undefined4 *)(local_20 + 2);
      local_388.elemsize._4_4_ = *(undefined4 *)((long)local_20 + 0x14);
      local_388.elempack = *(int *)(local_20 + 3);
      local_388._28_4_ = *(undefined4 *)((long)local_20 + 0x1c);
      local_388.allocator = (Allocator *)local_20[4];
      local_388._40_8_ = local_20[5];
      local_388._48_8_ = local_20[6];
      local_388._56_8_ = local_20[7];
      local_388.refcount = (int *)local_20[2];
      pMVar4 = &local_388;
      copy_make_border(in_stack_fffffffffffffb30,in_stack_fffffffffffffb28,
                       (int)((ulong)in_stack_fffffffffffffb20 >> 0x20),
                       (int)in_stack_fffffffffffffb20,in_stack_fffffffffffffb1c,
                       in_stack_fffffffffffffb18,in_stack_fffffffffffffb40,in_stack_fffffffffffffb14
                       ,(Option *)CONCAT44(in_stack_fffffffffffffb4c,in_stack_fffffffffffffb48));
      bVar2 = ncnn::Mat::empty(pMVar4);
      if (!bVar2) {
        local_24 = local_314;
        local_28 = local_310;
        goto LAB_004ad6c6;
      }
      local_4 = -100;
      local_98 = 1;
    }
    ncnn::Mat::~Mat((Mat *)0x4adbaa);
    goto joined_r0x004adbb3;
  }
  local_4 = 0;
  local_98 = 1;
LAB_004adbed:
  ncnn::Mat::~Mat((Mat *)0x4adbfa);
  return local_4;
}

Assistant:

int LRN_x86::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    int w = bottom_top_blob.w;
    int h = bottom_top_blob.h;
    int channels = bottom_top_blob.c;
    size_t elemsize = bottom_top_blob.elemsize;
    int size = w * h;

    // squared values with local_size padding
    Mat square_blob;
    square_blob.create(w, h, channels, elemsize, opt.workspace_allocator);
    if (square_blob.empty())
        return -100;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        const float* ptr = bottom_top_blob.channel(q);
        float* outptr = square_blob.channel(q);

        int i = 0;
#if __AVX__
        for (; i + 7 < size; i += 8)
        {
            __m256 _p = _mm256_loadu_ps(ptr);
            __m256 _outp = _mm256_mul_ps(_p, _p);
            _mm256_storeu_ps(outptr, _outp);

            ptr += 8;
            outptr += 8;
        }
#endif // __AVX__
        for (; i < size; i++)
        {
            *outptr = *ptr * *ptr;

            ptr++;
            outptr++;
        }
    }

    if (region_type == NormRegion_ACROSS_CHANNELS)
    {
        Mat square_sum;
        square_sum.create(w, h, channels, elemsize, opt.workspace_allocator);
        if (square_sum.empty())
            return -100;
        square_sum.fill(0.f);

        const float alpha_div_size = alpha / local_size;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            // square sum
            for (int p = q - local_size / 2; p <= q + local_size / 2; p++)
            {
                if (p < 0 || p >= channels)
                    continue;

                const float* sptr = square_blob.channel(p);
                float* ssptr = square_sum.channel(q);

                int i = 0;
#if __AVX__
                for (; i + 7 < size; i += 8)
                {
                    __m256 _sp = _mm256_loadu_ps(sptr);
                    __m256 _ssp = _mm256_loadu_ps(ssptr);
                    _ssp = _mm256_add_ps(_ssp, _sp);
                    _mm256_storeu_ps(ssptr, _ssp);

                    sptr += 8;
                    ssptr += 8;
                }
#endif // __AVX__
                for (; i < size; i++)
                {
                    *ssptr += *sptr;
                    sptr++;
                    ssptr++;
                }
            }

            float* ptr = bottom_top_blob.channel(q);
            float* ssptr = square_sum.channel(q);

            int i = 0;
#if __AVX__
            __m256 _bias = _mm256_set1_ps(bias);
            __m256 _ads = _mm256_set1_ps(alpha_div_size);
            __m256 _mb = _mm256_set1_ps(-beta);
            for (; i + 7 < size; i += 8)
            {
                __m256 _p = _mm256_loadu_ps(ptr);
                __m256 _ssp = _mm256_loadu_ps(ssptr);
                _ssp = _mm256_mul_ps(_ssp, _ads);
                _ssp = _mm256_add_ps(_ssp, _bias);
                _ssp = pow_ps(_ssp, _mb);
                _p = _mm256_mul_ps(_p, _ssp);
                _mm256_storeu_ps(ptr, _p);

                ssptr += 8;
                ptr += 8;
            }
#endif // __AVX__
            for (; i < size; i++)
            {
                *ptr = *ptr * pow(bias + alpha_div_size * *ssptr, -beta);

                ssptr++;
                ptr++;
            }
        }
    }
    else if (region_type == NormRegion_WITHIN_CHANNEL)
    {
        int outw = w;
        int outh = h;

        Mat square_blob_bordered = square_blob;
        int pad = local_size / 2;
        if (pad > 0)
        {
            Option opt_b = opt;
            opt_b.blob_allocator = opt.workspace_allocator;
            copy_make_border(square_blob, square_blob_bordered, pad, local_size - pad - 1, pad, local_size - pad - 1, BORDER_CONSTANT, 0.f, opt_b);
            if (square_blob_bordered.empty())
                return -100;

            w = square_blob_bordered.w;
            h = square_blob_bordered.h;
        }

        const int maxk = local_size * local_size;

        const float alpha_div_size = alpha / maxk;

        // norm window offsets
        std::vector<int> _space_ofs(maxk);
        int* space_ofs = &_space_ofs[0];
        {
            int p1 = 0;
            int p2 = 0;
            int gap = w - local_size;
            for (int i = 0; i < local_size; i++)
            {
                for (int j = 0; j < local_size; j++)
                {
                    space_ofs[p1] = p2;
                    p1++;
                    p2++;
                }
                p2 += gap;
            }
        }

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            float* ptr = bottom_top_blob.channel(q);
            const Mat m = square_blob_bordered.channel(q);

            for (int i = 0; i < outh; i++)
            {
                for (int j = 0; j < outw; j++)
                {
                    const float* sptr = m.row(i) + j;

                    float ss = 0.f;

                    for (int k = 0; k < maxk; k++)
                    {
                        float val = sptr[space_ofs[k]];
                        ss += val;
                    }

                    ptr[j] = ptr[j] * pow(bias + alpha_div_size * ss, -beta);
                }

                ptr += outw;
            }
        }
    }

    return 0;
}